

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedNumberFormat::setDecimalFormatSymbols
          (RuleBasedNumberFormat *this,DecimalFormatSymbols *symbols)

{
  DecimalFormatSymbols *this_00;
  
  this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)symbols);
  if (this_00 != (DecimalFormatSymbols *)0x0) {
    DecimalFormatSymbols::DecimalFormatSymbols(this_00,symbols);
  }
  (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x31])(this,this_00);
  return;
}

Assistant:

void
RuleBasedNumberFormat::setDecimalFormatSymbols(const DecimalFormatSymbols& symbols)
{
    adoptDecimalFormatSymbols(new DecimalFormatSymbols(symbols));
}